

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_lcl.c
# Opt level: O0

size_t bignStart_keep(size_t l,bign_deep_i deep)

{
  ulong n_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  code *in_RSI;
  long in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  size_t ec_deep;
  size_t ec_keep;
  size_t ec_d;
  size_t f_deep;
  size_t f_keep;
  size_t n;
  size_t no;
  undefined8 local_68;
  
  n_00 = in_RDI * 2 + 0x3fU >> 6;
  sVar1 = gfpCreate_keep(0x1747a6);
  sVar2 = gfpCreate_deep(0x1747b5);
  sVar3 = ecpCreateJ_keep(n_00);
  sVar4 = ecpCreateJ_deep(in_stack_00000008,unaff_retaddr);
  sVar5 = ecCreateGroup_deep(sVar2);
  if (in_RSI == (code *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = (*in_RSI)(n_00,sVar2,3,sVar4);
  }
  sVar2 = utilMax(3,sVar4,sVar5,local_68);
  return sVar1 + sVar3 + sVar2;
}

Assistant:

size_t bignStart_keep(size_t l, bign_deep_i deep)
{
	// размерности
	size_t no = O_OF_B(2 * l);
	size_t n = W_OF_B(2 * l);
	size_t f_keep = gfpCreate_keep(no);
	size_t f_deep = gfpCreate_deep(no);
	size_t ec_d = 3;
	size_t ec_keep = ecpCreateJ_keep(n);
	size_t ec_deep = ecpCreateJ_deep(n, f_deep);
	// расчет
	return f_keep + ec_keep +
		utilMax(3,
			ec_deep,
			ecCreateGroup_deep(f_deep),
			deep ? deep(n, f_deep, ec_d, ec_deep) : 0);
}